

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O1

void __thiscall IR::Instr::GenerateBytecodeArgOutCapture(Instr *this)

{
  bool bVar1;
  ArgSlot argSlotNum;
  uint32 offset;
  StackSym *pSVar2;
  Instr *this_00;
  
  bVar1 = HasByteCodeArgOutCapture(this);
  if (bVar1) {
    return;
  }
  pSVar2 = Opnd::GetStackSym(this->m_dst);
  pSVar2->field_0x1b = pSVar2->field_0x1b | 2;
  pSVar2 = Opnd::GetStackSym(this->m_dst);
  argSlotNum = StackSym::GetArgSlotNum(pSVar2);
  pSVar2 = StackSym::NewArgSlotRegSym(argSlotNum,this->m_func,this->m_dst->m_type);
  this_00 = HoistSrc1(this,BytecodeArgOutCapture,RegNOREG,pSVar2);
  offset = GetByteCodeOffset(this);
  SetByteCodeOffset(this_00,offset);
  return;
}

Assistant:

void Instr::GenerateBytecodeArgOutCapture()
{
    if (!HasByteCodeArgOutCapture())
    {
        this->m_dst->GetStackSym()->m_isArgCaptured = true;
        StackSym* tmpSym = StackSym::NewArgSlotRegSym(this->GetDst()->GetStackSym()->GetArgSlotNum(), this->m_func, this->GetDst()->GetType());
        IR::Instr* instr = this->HoistSrc1(Js::OpCode::BytecodeArgOutCapture, RegNOREG, tmpSym);
        instr->SetByteCodeOffset(this);
    }
}